

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Deque.hpp
# Opt level: O2

Clause * __thiscall Lib::Deque<Kernel::Clause_*>::pop_front(Deque<Kernel::Clause_*> *this)

{
  Clause *pCVar1;
  Clause **ppCVar2;
  
  pCVar1 = *this->_front;
  ppCVar2 = this->_front + 1;
  this->_front = ppCVar2;
  if (ppCVar2 != this->_end) {
    return pCVar1;
  }
  this->_front = this->_data;
  return pCVar1;
}

Assistant:

inline
  C pop_front()
  {
    ASS(isNonEmpty());

    C res=*_front;
    _front->~C();

    _front++;
    if(_front==_end) {
      _front=_data;
    }

    return res;
  }